

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O0

void __thiscall MutableS2ShapeIndex::Iterator::Begin(Iterator *this)

{
  bool bVar1;
  ostream *poVar2;
  const_iterator cVar3;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  Iterator *local_10;
  Iterator *this_local;
  
  local_10 = this;
  bVar1 = is_fresh(this->index_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    cVar3 = gtl::internal_btree::
            btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
            ::begin((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                     *)&this->index_->cell_map_);
    (this->iter_).node = cVar3.node;
    (this->iter_).position = cVar3.position;
    Refresh(this);
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.h"
             ,0x216,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: index_->is_fresh() ");
  S2LogMessageVoidify::operator&(&local_11,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

inline void MutableS2ShapeIndex::Iterator::Begin() {
  // Make sure that the index has not been modified since Init() was called.
  S2_DCHECK(index_->is_fresh());
  iter_ = index_->cell_map_.begin();
  Refresh();
}